

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::emitUnreachable
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this)

{
  Function *pFVar1;
  Expression *local_18;
  
  pFVar1 = this[4].func;
  local_18 = (Expression *)Builder::makeUnreachable((Builder *)(this + 2));
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &pFVar1[-1].delimiterLocations._M_h._M_single_bucket,&local_18);
  return;
}

Assistant:

void emitUnreachable() { static_cast<SubType*>(this)->emitUnreachable(); }